

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

bool __thiscall
Shell::Options::OptionValue<Shell::Options::SplittingAddComplementary>::checkProblemConstraints
          (OptionValue<Shell::Options::SplittingAddComplementary> *this,Property *prop)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  BadOption BVar4;
  pointer pOVar5;
  ostream *poVar6;
  UserErrorException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  RefIterator it;
  
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
  ::RefIterator::RefIterator(&it,&this->_prob_constraints);
  do {
    do {
      bVar1 = Lib::
              Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
              ::RefIterator::hasNext(&it);
      if (!bVar1) goto LAB_005c276e;
      Lib::
      Stack<std::unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>_>
      ::RefIterator::next(&it);
    } while ((this->super_AbstractOptionValue).is_set != true);
    pOVar5 = std::
             unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
             ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                           *)0x5c26d6);
    iVar2 = (**pOVar5->_vptr_OptionProblemConstraint)(pOVar5,prop);
  } while ((char)iVar2 != '\0');
  MVar3 = mode(Lib::env);
  if (MVar3 == SPIDER) {
    reportSpiderFail();
    this_00 = (UserErrorException *)__cxa_allocate_exception(0x50);
    std::operator+(&local_a0,"% WARNING: ",&(this->super_AbstractOptionValue).longName);
    pOVar5 = std::
             unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
             ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                           *)0x5c27b2);
    (*pOVar5->_vptr_OptionProblemConstraint[1])(&local_80,pOVar5);
    std::operator+(&local_60,&local_a0,&local_80);
    Lib::UserErrorException::Exception(this_00,&local_60);
    __cxa_throw(this_00,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  BVar4 = getBadOptionChoice(Lib::env);
  if (BVar4 != OFF) {
    poVar6 = std::operator<<((ostream *)&std::cout,"% WARNING: ");
    poVar6 = std::operator<<(poVar6,(string *)&(this->super_AbstractOptionValue).longName);
    pOVar5 = std::
             unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
             ::operator->((unique_ptr<Shell::Options::OptionProblemConstraint,_std::default_delete<Shell::Options::OptionProblemConstraint>_>
                           *)0x5c2739);
    (*pOVar5->_vptr_OptionProblemConstraint[1])(&local_a0,pOVar5);
    poVar6 = std::operator<<(poVar6,(string *)&local_a0);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_a0);
  }
LAB_005c276e:
  return !bVar1;
}

Assistant:

bool Options::OptionValue<T>::checkProblemConstraints(Property* prop){
    Lib::Stack<OptionProblemConstraintUP>::RefIterator it(_prob_constraints);
    while(it.hasNext()){
      OptionProblemConstraintUP& con = it.next();
      // Constraint should hold whenever the option is set
      if(is_set && !con->check(prop)){

         if (env.options->mode() == Mode::SPIDER){
           reportSpiderFail();
           USER_ERROR("% WARNING: " + longName + con->msg());
         }

         switch(env.options->getBadOptionChoice()){
         case BadOption::OFF: break;
         default:
           cout << "% WARNING: " << longName << con->msg() << endl;
         }
         return false;
      }
    }
    return true;
}